

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O1

flatcc_builder_ref_t flatcc_builder_create_string(flatcc_builder_t *B,char *s,size_t len)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  flatcc_builder_ref_t fVar4;
  flatbuffers_uoffset_t length_prefix;
  flatcc_iov_state_t iov;
  uint local_a4;
  ulong local_a0;
  int local_98;
  flatcc_iovec_t local_90;
  char *local_80;
  size_t local_78;
  
  fVar4 = 0;
  if (len >> 0x20 == 0) {
    local_90.iov_base = &local_a4;
    local_a4 = (uint)len;
    iVar1 = B->emit_start;
    local_a0 = 4;
    local_90.iov_len = 4;
    local_98 = 1;
    if (len != 0) {
      local_a0 = len + 4;
      local_98 = 2;
      local_80 = s;
      local_78 = len;
    }
    uVar2 = (ulong)((~local_a4 + iVar1 & 3) + 1);
    local_a0 = local_a0 + uVar2;
    lVar3 = (long)local_98;
    local_98 = local_98 + 1;
    (&local_90)[lVar3].iov_base = "";
    (&local_90)[lVar3].iov_len = uVar2;
    if ((0x10000000 < local_a0 >> 4) || ((int)local_a0 < 1)) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                    ,0x295,
                    "flatcc_builder_ref_t emit_front(flatcc_builder_t *, flatcc_iov_state_t *)");
    }
    fVar4 = iVar1 - (int)local_a0;
    iVar1 = (*B->emit)(B->emit_context,&local_90,local_98,fVar4,local_a0);
    if (iVar1 != 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                    ,0x299,
                    "flatcc_builder_ref_t emit_front(flatcc_builder_t *, flatcc_iov_state_t *)");
    }
    B->emit_start = fVar4;
  }
  return fVar4;
}

Assistant:

flatcc_builder_ref_t flatcc_builder_create_string(flatcc_builder_t *B, const char *s, size_t len)
{
    uoffset_t s_pad;
    uoffset_t length_prefix;
    iov_state_t iov;

    if (len > max_string_len) {
        return 0;
    }
    write_uoffset(&length_prefix, (uoffset_t)len);
    /* Add 1 for zero termination. */
    s_pad = front_pad(B, (uoffset_t)len + 1, field_size) + 1;
    init_iov();
    push_iov(&length_prefix, field_size);
    push_iov(s, len);
    push_iov(_pad, s_pad);
    return emit_front(B, &iov);
}